

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall
cs::repl::interpret(repl *this,string *code,
                   deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line)

{
  context_t *pcVar1;
  method_base **ppmVar2;
  method_base **ppmVar3;
  element_type *peVar4;
  stack_pointer psVar5;
  element_type *peVar6;
  pointer paVar7;
  undefined *puVar8;
  int iVar9;
  method_base *pmVar10;
  domain_type *domain_00;
  long *plVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  element_type *peVar12;
  error *peVar13;
  runtime_error *prVar14;
  method_base *pmVar15;
  stack_pointer this_00;
  any *it_3;
  long lVar16;
  any *it;
  pointer this_01;
  any *it_1;
  domain_type domain;
  undefined1 local_148 [32];
  _Elt_pointer local_128;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  CStack_120;
  _Elt_pointer local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  _Elt_pointer local_108;
  pointer paStack_100;
  undefined1 local_e0 [80];
  undefined1 local_90 [96];
  undefined4 extraout_var;
  
  pcVar1 = &this->context;
  pmVar10 = translator_type::match
                      (&((((this->context).
                           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->compiler).
                         super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        translator,line);
  iVar9 = (*pmVar10->_vptr_method_base[2])(pmVar10);
  switch(iVar9) {
  case 0:
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Null type of grammar.","");
    runtime_error::runtime_error(prVar14,(string *)local_148);
    __cxa_throw(prVar14,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 1:
    ppmVar3 = (this->methods).m_current;
    ppmVar2 = (this->methods).m_start;
    iVar9 = (*pmVar10->_vptr_method_base[3])(pmVar10);
    if (ppmVar3 == ppmVar2) {
      if (iVar9 == 0x19) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_148,"Hanging end statement.","");
        runtime_error::runtime_error(prVar14,(string *)local_148);
        __cxa_throw(prVar14,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
      local_108 = (_Elt_pointer)0x0;
      paStack_100 = (pointer)0x0;
      local_118 = (_Elt_pointer)0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128 = (_Elt_pointer)0x0;
      CStack_120.
      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
      .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                  )0x0;
      local_148._16_8_ = (_Elt_pointer)0x0;
      local_148._24_8_ = (_Elt_pointer)0x0;
      local_148._0_8_ = (_Map_pointer)0x0;
      local_148._8_8_ = (slot_type *)0x0;
      std::
      deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
      ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                  *)local_148,local_e0,local_90);
      (*pmVar10->_vptr_method_base[4])(pmVar10,pcVar1,local_148);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)local_148);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
      local_108 = (_Elt_pointer)0x0;
      paStack_100 = (pointer)0x0;
      local_118 = (_Elt_pointer)0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128 = (_Elt_pointer)0x0;
      CStack_120.
      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
      .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                  )0x0;
      local_148._16_8_ = (_Elt_pointer)0x0;
      local_148._24_8_ = (_Elt_pointer)0x0;
      local_148._0_8_ = (_Map_pointer)0x0;
      local_148._8_8_ = (slot_type *)0x0;
      std::
      deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
      ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                  *)local_148,local_e0,local_90);
      iVar9 = (*pmVar10->_vptr_method_base[5])(pmVar10,pcVar1,local_148);
      plVar11 = (long *)CONCAT44(extraout_var,iVar9);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)local_148);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
    }
    else {
      if (iVar9 == 0x19) {
        stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
        ::pop_no_return(&(((((pcVar1->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->instance).
                           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->super_runtime_type).storage.m_set);
        domain_00 = domain_manager::get_domain
                              (&(((((pcVar1->
                                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->instance).
                                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->super_runtime_type).storage);
        domain_type::domain_type((domain_type *)local_148,domain_00);
        domain_manager::remove_domain
                  (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage);
        ppmVar3 = (this->methods).m_current;
        if (ppmVar3 == (this->methods).m_start) {
          peVar13 = (error *)__cxa_allocate_exception(0x28);
          local_e0._0_8_ = local_e0 + 0x10;
          local_e0._16_4_ = 0x30303045;
          local_e0._20_2_ = 0x48;
          local_e0._8_8_ = 5;
          cov::error::error(peVar13,(string *)local_e0);
          __cxa_throw(peVar13,&cov::error::typeinfo,cov::error::~error);
        }
        pmVar15 = ppmVar3[-1];
        (*pmVar15->_vptr_method_base[6])(pmVar15,pcVar1,local_148);
        ppmVar3 = (this->methods).m_current;
        if (ppmVar3 == (this->methods).m_start) {
          peVar13 = (error *)__cxa_allocate_exception(0x28);
          local_e0._0_8_ = local_e0 + 0x10;
          local_e0._16_4_ = 0x30303045;
          local_e0._20_2_ = 0x48;
          local_e0._8_8_ = 5;
          cov::error::error(peVar13,(string *)local_e0);
          __cxa_throw(peVar13,&cov::error::typeinfo,cov::error::~error);
        }
        pmVar15 = ppmVar3[-1];
        (this->methods).m_current = ppmVar3 + -1;
        domain_type::~domain_type((domain_type *)local_148);
      }
      else {
        pmVar15 = (method_base *)0x0;
      }
      if ((this->methods).m_current != (this->methods).m_start) {
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
        local_108 = (_Elt_pointer)0x0;
        paStack_100 = (pointer)0x0;
        local_118 = (_Elt_pointer)0x0;
        _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128 = (_Elt_pointer)0x0;
        CStack_120.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                    )0x0;
        local_148._16_8_ = (_Elt_pointer)0x0;
        local_148._24_8_ = (_Elt_pointer)0x0;
        local_148._0_8_ = (_Map_pointer)0x0;
        local_148._8_8_ = (slot_type *)0x0;
        std::
        deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
        ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                  ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                    *)local_148,local_e0,local_90);
        (*pmVar10->_vptr_method_base[4])(pmVar10,pcVar1,local_148);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)local_148);
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                  ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back(&this->tmp,line);
        break;
      }
      iVar9 = (*pmVar10->_vptr_method_base[3])(pmVar10);
      if (iVar9 == 0x19) {
        iVar9 = (*pmVar10->_vptr_method_base[7])(pmVar10,pmVar15,pcVar1,this,line);
        plVar11 = (long *)CONCAT44(extraout_var_00,iVar9);
      }
      else {
        iVar9 = (*pmVar15->_vptr_method_base[5])(pmVar15,pcVar1,this);
        plVar11 = (long *)CONCAT44(extraout_var_01,iVar9);
      }
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::clear(&this->tmp);
    }
    puVar8 = current_process;
    if (plVar11 != (long *)0x0) {
      if (this->echo == true) {
        lVar16 = 0x20;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar8 + 0xd0),(void *)0x0);
        }
      }
      else {
        lVar16 = 0x18;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar8 + 0xd0),(void *)0x0);
        }
      }
      (**(code **)(*plVar11 + lVar16))(plVar11);
    }
    break;
  case 2:
    ppmVar3 = (this->methods).m_current;
    if ((long)ppmVar3 - (long)(this->methods).m_start >> 3 == (this->methods).m_size) {
      peVar13 = (error *)__cxa_allocate_exception(0x28);
      local_148._0_8_ = local_148 + 0x10;
      local_148._16_6_ = 0x4930303045;
      local_148._8_8_ = (slot_type *)0x5;
      cov::error::error(peVar13,(string *)local_148);
      __cxa_throw(peVar13,&cov::error::typeinfo,cov::error::~error);
    }
    (this->methods).m_current = ppmVar3 + 1;
    *ppmVar3 = pmVar10;
    peVar4 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    psVar5 = *(peVar4->super_runtime_type).storage.fiber_stack;
    this_00 = &(peVar4->super_runtime_type).storage.m_data;
    if (psVar5 != (stack_pointer)0x0) {
      this_00 = psVar5;
    }
    stack_type<cs::domain_type,_std::allocator>::push<>(this_00);
    domain_manager::add_set
              (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
    ppmVar3 = (this->methods).m_current;
    if (ppmVar3 == (this->methods).m_start) {
      peVar13 = (error *)__cxa_allocate_exception(0x28);
      local_148._0_8_ = local_148 + 0x10;
      local_148._16_6_ = 0x4830303045;
      local_148._8_8_ = (slot_type *)0x5;
      cov::error::error(peVar13,(string *)local_148);
      __cxa_throw(peVar13,&cov::error::typeinfo,cov::error::~error);
    }
    pmVar10 = ppmVar3[-1];
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
    local_108 = (_Elt_pointer)0x0;
    paStack_100 = (pointer)0x0;
    local_118 = (_Elt_pointer)0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (_Elt_pointer)0x0;
    CStack_120.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                )0x0;
    local_148._16_8_ = (_Elt_pointer)0x0;
    local_148._24_8_ = (_Elt_pointer)0x0;
    local_148._0_8_ = (_Map_pointer)0x0;
    local_148._8_8_ = (slot_type *)0x0;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)local_148,local_e0,local_90);
    (*pmVar10->_vptr_method_base[4])(pmVar10,pcVar1,local_148);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_148);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::push_back(&this->tmp,line);
    break;
  case 3:
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
    local_108 = (_Elt_pointer)0x0;
    paStack_100 = (pointer)0x0;
    local_118 = (_Elt_pointer)0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (_Elt_pointer)0x0;
    CStack_120.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                )0x0;
    local_148._16_8_ = (_Elt_pointer)0x0;
    local_148._24_8_ = (_Elt_pointer)0x0;
    local_148._0_8_ = (_Map_pointer)0x0;
    local_148._8_8_ = (slot_type *)0x0;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)local_148,local_e0,local_90);
    (*pmVar10->_vptr_method_base[5])(pmVar10,pcVar1,local_148);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_148);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
  }
  peVar12 = (pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar6 = (peVar12->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_01 = *(pointer *)
             &(peVar6->constant_pool).
              super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>;
  paVar7 = (peVar6->constant_pool).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != paVar7) {
    do {
      cs_impl::any::constant(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != paVar7);
    peVar12 = (pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  domain_manager::clear_set
            (&(((peVar12->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage);
  return;
}

Assistant:

void repl::interpret(const string &code, std::deque<token_base *> &line)
	{
		statement_base *sptr = nullptr;
		try {
			method_base *m = context->compiler->match_method(line);
			switch (m->get_type()) {
			case method_types::null:
				throw runtime_error("Null type of grammar.");
				break;
			case method_types::single: {
				if (!methods.empty()) {
					method_base *expected_method = nullptr;
					if (m->get_target_type() == statement_types::end_) {
						context->instance->storage.remove_set();
						domain_type domain = std::move(context->instance->storage.get_domain());
						context->instance->storage.remove_domain();
						methods.top()->postprocess(context, domain);
						expected_method = methods.top();
						methods.pop();
					}
					if (methods.empty()) {
						if (m->get_target_type() == statement_types::end_)
							sptr = static_cast<method_end *>(m)->translate_end(expected_method, context, tmp,
							        line);
						else
							sptr = expected_method->translate(context, tmp);
						tmp.clear();
					}
					else {
						m->preprocess(context, {line});
						tmp.push_back(line);
					}
				}
				else {
					if (m->get_target_type() == statement_types::end_)
						throw runtime_error("Hanging end statement.");
					else {
						m->preprocess(context, {line});
						sptr = m->translate(context, {line});
					}
				}
			}
			break;
			case method_types::block: {
				methods.push(m);
				context->instance->storage.add_domain();
				context->instance->storage.add_set();
				methods.top()->preprocess(context, {line});
				tmp.push_back(line);
			}
			break;
			case method_types::jit_command:
				m->translate(context, {line});
				break;
			}
			if (sptr != nullptr)
				echo ? sptr->repl_run() : sptr->run();
		}
		catch (const lang_error &le) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw fatal_error(std::string("Uncaught exception: ") + le.what());
		}
		catch (const cs::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw e;
		}
		catch (const std::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw exception(line_num, context->file_path, code, e.what());
		}
		context->compiler->utilize_metadata();
		context->instance->storage.clear_set();
	}